

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O1

void ggml_opt_epoch(ggml_opt_context_t opt_ctx,ggml_opt_dataset_t dataset,
                   ggml_opt_result_t result_train,ggml_opt_result_t result_eval,int64_t idata_split,
                   ggml_opt_epoch_callback callback_train,ggml_opt_epoch_callback callback_eval)

{
  ggml_tensor *data_batch;
  ggml_tensor *labels_batch;
  long lVar1;
  long lVar2;
  int64_t iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  int line;
  
  data_batch = opt_ctx->inputs;
  if (dataset->data->ne[0] == data_batch->ne[0]) {
    lVar5 = dataset->data->ne[1];
    lVar6 = data_batch->ne[1];
    lVar1 = lVar5 / lVar6;
    if (lVar5 % lVar6 == 0) {
      if (-1 < idata_split) {
        lVar5 = idata_split;
      }
      lVar2 = lVar5 / lVar6;
      if (lVar5 % lVar6 == 0) {
        labels_batch = opt_ctx->labels;
        iVar3 = ggml_time_us();
        if (lVar2 < 1) {
          lVar5 = 0;
        }
        else {
          lVar6 = 0;
          do {
            ggml_opt_dataset_get_batch(dataset,data_batch,labels_batch,lVar6);
            ggml_opt_forward_backward(opt_ctx,result_train);
            if (callback_train != (ggml_opt_epoch_callback)0x0) {
              (*callback_train)(true,opt_ctx,dataset,result_train,lVar6 + 1,lVar2,iVar3);
            }
            lVar6 = lVar6 + 1;
            lVar5 = lVar2;
          } while (lVar2 != lVar6);
        }
        iVar3 = ggml_time_us();
        if (lVar5 < lVar1) {
          do {
            ggml_opt_dataset_get_batch(dataset,data_batch,labels_batch,lVar5);
            ggml_opt_eval_graph(opt_ctx,opt_ctx->gf,result_eval);
            if (callback_eval != (ggml_opt_epoch_callback)0x0) {
              (*callback_eval)(false,opt_ctx,dataset,result_eval,lVar5 + (1 - lVar2),lVar1 - lVar2,
                               iVar3);
            }
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        return;
      }
      pcVar4 = "idata_split % ndata_batch == 0";
      line = 0x2b9;
    }
    else {
      pcVar4 = "data->ne[1] % inputs->ne[1] == 0";
      line = 0x2b5;
    }
  }
  else {
    pcVar4 = "data->ne[0] == inputs->ne[0]";
    line = 0x2b0;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

void ggml_opt_epoch(
        ggml_opt_context_t      opt_ctx,
        ggml_opt_dataset_t      dataset,
        ggml_opt_result_t       result_train,
        ggml_opt_result_t       result_eval,
        int64_t                 idata_split,
        ggml_opt_epoch_callback callback_train,
        ggml_opt_epoch_callback callback_eval) {
    struct ggml_tensor * inputs = ggml_opt_inputs(opt_ctx);
    struct ggml_tensor * labels = ggml_opt_labels(opt_ctx);
    struct ggml_tensor * data   = ggml_opt_dataset_data(dataset);
    GGML_ASSERT(data->ne[0] == inputs->ne[0]);

    const int64_t ndata       =   data->ne[1];
    const int64_t ndata_batch = inputs->ne[1];

    GGML_ASSERT(data->ne[1] % inputs->ne[1] == 0);
    const int64_t nbatches = ndata/ndata_batch;

    idata_split = idata_split < 0 ? ndata : idata_split;
    GGML_ASSERT(idata_split % ndata_batch == 0);
    const int64_t ibatch_split = idata_split / ndata_batch;

    int64_t ibatch = 0;
    int64_t t_loop_start = ggml_time_us();
    for (; ibatch < ibatch_split; ++ibatch) {
        ggml_opt_dataset_get_batch(dataset, inputs, labels, ibatch);
        ggml_opt_forward_backward(opt_ctx, result_train);
        if (callback_train) {
            callback_train(true, opt_ctx, dataset, result_train, ibatch+1, ibatch_split, t_loop_start);
        }
    }
    t_loop_start = ggml_time_us();
    for (; ibatch < nbatches; ++ibatch) {
        ggml_opt_dataset_get_batch(dataset, inputs, labels, ibatch);
        ggml_opt_forward(opt_ctx, result_eval);
        if (callback_eval) {
            callback_eval(false, opt_ctx, dataset, result_eval, ibatch+1-ibatch_split, nbatches-ibatch_split, t_loop_start);
        }
    }
}